

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# didxset.cpp
# Opt level: O3

void __thiscall soplex::DIdxSet::~DIdxSet(DIdxSet *this)

{
  int *__ptr;
  
  (this->super_IdxSet)._vptr_IdxSet = (_func_int **)&PTR__DIdxSet_006a8bc8;
  __ptr = (this->super_IdxSet).idx;
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  operator_delete(this,0x20);
  return;
}

Assistant:

DIdxSet::~DIdxSet()
{
   if(idx)
      spx_free(idx);
}